

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata_unittest.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_3377::ProfileDataTest_OpsWhenStopped_Test::TestBody
          (ProfileDataTest_OpsWhenStopped_Test *this)

{
  int iVar1;
  State *after;
  ProfileData *this_00;
  char *in_R9;
  pointer *__ptr;
  char *pcVar2;
  undefined1 local_890 [8];
  State state_before;
  State state_after;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  void *trace [5];
  AssertHelper local_28;
  
  ProfileDataTest::ExpectStopped
            ((ProfileDataTest *)(ulong)(uint)(this->super_ProfileDataTest).collector_.out_);
  iVar1 = (this->super_ProfileDataTest).collector_.out_;
  state_before.samples_gathered._0_1_ = (byte)((uint)iVar1 >> 0x1f);
  state_after.enabled = false;
  state_after._1_7_ = 0;
  if (-1 < iVar1) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_890,(internal *)&state_before.samples_gathered,
               (AssertionResult *)"collector_.enabled()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x152,(char *)CONCAT71(local_890._1_7_,local_890[0]));
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((time_t *)CONCAT71(local_890._1_7_,local_890[0]) != &state_before.start_time) {
      operator_delete((undefined1 *)CONCAT71(local_890._1_7_,local_890[0]),
                      state_before.start_time + 1);
    }
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
    if (state_after._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&state_after,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   state_after._0_8_);
    }
  }
  this_00 = &(this->super_ProfileDataTest).collector_;
  ProfileData::GetCurrentState(this_00,(State *)local_890);
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_58._M_head_impl._1_7_,local_890[0]) ^ 1);
  trace[0] = (void *)0x0;
  if (local_890[0] != false) {
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&state_before.samples_gathered,(internal *)&local_58,
               (AssertionResult *)"state_before.enabled","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&state_after.samples_gathered,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x157,(char *)CONCAT71(state_before._1041_7_,(byte)state_before.samples_gathered));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&state_after.samples_gathered,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&state_after.samples_gathered);
    if ((time_t *)CONCAT71(state_before._1041_7_,(byte)state_before.samples_gathered) !=
        &state_after.start_time) {
      operator_delete((undefined1 *)
                      CONCAT71(state_before._1041_7_,(byte)state_before.samples_gathered),
                      state_after.start_time + 1);
    }
    if (local_28.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_28.data_ + 8))();
    }
    if (trace[0] != (void *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)trace,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            trace[0]);
    }
  }
  local_58._M_head_impl = local_58._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&state_before.samples_gathered,"0","state_before.samples_gathered",
             (int *)&local_58,(int *)(state_before.profile_name + 0x3f8));
  if ((byte)state_before.samples_gathered == 0) {
    testing::Message::Message((Message *)&local_58);
    if (state_after._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)state_after._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x158,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (state_after._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&state_after,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 state_after._0_8_);
  }
  local_58._M_head_impl = local_58._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&state_before.samples_gathered,"0","state_before.start_time",
             (int *)&local_58,(long *)&state_before);
  if ((byte)state_before.samples_gathered == 0) {
    testing::Message::Message((Message *)&local_58);
    if (state_after._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)state_after._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x159,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (state_after._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&state_after,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 state_after._0_8_);
  }
  pcVar2 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&state_before.samples_gathered,"\"\"","state_before.profile_name","",
             (char *)&state_before.start_time);
  if ((byte)state_before.samples_gathered == 0) {
    testing::Message::Message((Message *)&local_58);
    if (state_after._0_8_ != 0) {
      pcVar2 = *(char **)state_after._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x15a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (state_after._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&state_after,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 state_after._0_8_);
  }
  ProfileData::Stop(this_00);
  ProfileData::FlushTable(this_00);
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x64;
  trace[0] = (void *)0x65;
  trace[1] = (void *)0x66;
  trace[2] = (void *)0x67;
  trace[3] = (void *)0x68;
  ProfileData::Add(this_00,5,&local_58._M_head_impl);
  ProfileData::GetCurrentState(this_00,(State *)&state_before.samples_gathered);
  ProfileDataTest::ExpectSameState
            ((ProfileDataTest *)local_890,(State *)&state_before.samples_gathered,after);
  return;
}

Assistant:

TEST_F(ProfileDataTest, OpsWhenStopped) {
  ExpectStopped();
  EXPECT_FALSE(collector_.enabled());

  // Verify that state is disabled, all-empty/all-0
  ProfileData::State state_before;
  collector_.GetCurrentState(&state_before);
  EXPECT_FALSE(state_before.enabled);
  EXPECT_EQ(0, state_before.samples_gathered);
  EXPECT_EQ(0, state_before.start_time);
  EXPECT_STREQ("", state_before.profile_name);

  // Safe to call stop again.
  collector_.Stop();

  // Safe to call FlushTable.
  collector_.FlushTable();

  // Safe to call Add.
  const void *trace[] = { V(100), V(101), V(102), V(103), V(104) };
  collector_.Add(arraysize(trace), trace);

  ProfileData::State state_after;
  collector_.GetCurrentState(&state_after);

  ExpectSameState(state_before, state_after);
}